

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O0

int cfg_schema_tobin_tokens(cfg_schema_entry *s_entry,const_strarray *value,void *reference)

{
  int iVar1;
  size_t sVar2;
  void *reference_local;
  const_strarray *value_local;
  cfg_schema_entry *s_entry_local;
  
  if (((s_entry->list & 1U) != 0) && (sVar2 = strlen(value->value), sVar2 < value->length)) {
    return -1;
  }
  iVar1 = cfg_tobin_tokens(reference,value->value,(cfg_schema_entry *)s_entry->validate_param[0].ptr
                           ,s_entry->validate_param[1].s,
                           (cfg_schema_token_customizer *)s_entry->validate_param[2].ptr);
  return iVar1;
}

Assistant:

int
cfg_schema_tobin_tokens(const struct cfg_schema_entry *s_entry, const struct const_strarray *value, void *reference) {
  if (s_entry->list && strlen(value->value) < value->length) {
    /* we don't support direct list conversion to binary */
    return -1;
  }
  return cfg_tobin_tokens(reference, strarray_get_first_c(value), s_entry->validate_param[0].ptr,
    s_entry->validate_param[1].s, s_entry->validate_param[2].ptr);
}